

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::Utils::Program::GetUniformIndices
          (Program *this,GLsizei count,GLchar **names,GLuint *indices)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GLuint *indices_local;
  GLchar **names_local;
  GLsizei count_local;
  Program *this_local;
  
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  GetUniformIndices((Functions *)CONCAT44(extraout_var,iVar1),this->m_id,count,names,indices);
  return;
}

Assistant:

void Program::GetUniformIndices(GLsizei count, const GLchar** names, GLuint* indices) const
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	GetUniformIndices(gl, m_id, count, names, indices);
}